

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<std::pair<int,_long>,_60>::TPZManVector
          (TPZManVector<std::pair<int,_long>,_60> *this,int64_t size)

{
  long lVar1;
  pair<int,_long> *ppVar2;
  pair<int,_long> *ppVar3;
  int64_t iVar4;
  
  TPZVec<std::pair<int,_long>_>::TPZVec(&this->super_TPZVec<std::pair<int,_long>_>,0);
  (this->super_TPZVec<std::pair<int,_long>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0164d420;
  lVar1 = 0x28;
  do {
    *(undefined4 *)((long)this->fExtAlloc + lVar1 + -0x28) = 0;
    *(undefined8 *)
     ((long)&(((TPZManVector<std::pair<int,_long>,_60> *)(this->fExtAlloc + -2))->
             super_TPZVec<std::pair<int,_long>_>)._vptr_TPZVec + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 1000);
  if (size < 0x3d) {
    ppVar2 = this->fExtAlloc;
    iVar4 = 0;
  }
  else {
    ppVar2 = (pair<int,_long> *)operator_new__(-(ulong)((ulong)size >> 0x3c != 0) | size * 0x10);
    ppVar3 = ppVar2;
    do {
      ppVar3->first = 0;
      ppVar3->second = 0;
      ppVar3 = ppVar3 + 1;
      iVar4 = size;
    } while (ppVar3 != ppVar2 + size);
  }
  (this->super_TPZVec<std::pair<int,_long>_>).fStore = ppVar2;
  (this->super_TPZVec<std::pair<int,_long>_>).fNElements = size;
  (this->super_TPZVec<std::pair<int,_long>_>).fNAlloc = iVar4;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}